

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::CoherentBlendTestCaseGroup::CoherentBlendTest::iterate(CoherentBlendTest *this)

{
  BlendStep *pBVar1;
  GLfloat GVar2;
  GLfloat GVar3;
  GLfloat GVar4;
  glUseProgramFunc p_Var5;
  glClearColorFunc p_Var6;
  glUniform4fFunc p_Var7;
  glGetUniformLocationFunc p_Var8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  deUint32 dVar12;
  GLenum GVar13;
  GLint GVar14;
  RenderContext *pRVar15;
  undefined4 extraout_var;
  PixelFormat *this_00;
  Functions *gl_00;
  TestLog *this_01;
  char *pcVar16;
  TestError *this_02;
  float *pfVar17;
  MessageBuilder *pMVar18;
  GLSLVersion glslVersion;
  char *extensionDirective;
  bool local_67b;
  bool local_67a;
  RGBA local_540;
  deUint32 local_53c;
  deUint32 local_538;
  RGBA local_534;
  MessageBuilder local_530;
  bool local_3a9;
  int local_3a8;
  bool pass;
  int i_1;
  deUint32 dStack_39c;
  bool allSame;
  deUint32 local_398;
  byte local_391;
  RGBA local_390;
  RGBA RStack_38c;
  bool firstOk;
  RGBA local_388;
  RGBA local_384;
  RGBA threshold;
  RGBA local_37c;
  RGBA ref;
  RGBA res;
  GLubyte *result;
  glcts agStack_358 [8];
  Vec4 refCol;
  Vec4 srcCol;
  BlendStep *s;
  int local_328;
  int j;
  int i;
  undefined1 local_300 [8];
  VertexArrayBinding posBinding;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  string local_260;
  ProgramSources local_240;
  undefined1 local_170 [8];
  ShaderProgram p;
  undefined1 local_90 [8];
  string frgSrc;
  FBOSentry fbo;
  Vec4 dstCol;
  bool needBarrier;
  TestLog *log;
  Functions *gl;
  PixelFormat *pf;
  RenderTarget *rt;
  CoherentBlendTest *this_local;
  undefined4 extraout_var_00;
  
  pRVar15 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar11 = (*pRVar15->_vptr_RenderContext[4])();
  this_00 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var,iVar11));
  pRVar15 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar11 = (*pRVar15->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var_00,iVar11);
  this_01 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  bVar9 = IsExtensionSupported((this->super_TestCase).m_context,"GL_KHR_blend_equation_advanced");
  if (bVar9) {
    bVar9 = IsExtensionSupported
                      ((this->super_TestCase).m_context,"GL_KHR_blend_equation_advanced_coherent");
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(fbo.m_rbo + 1),0.0,0.0,0.0,0.0);
    extensionDirective = (char *)0x8058;
    FBOSentry::FBOSentry((FBOSentry *)((long)&frgSrc.field_2 + 8),gl_00,0x400,0x400,0x8058);
    pcVar16 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
    GetSolidShader_abi_cxx11_
              ((string *)local_90,(glcts *)"blend_support_all_equations",pcVar16,
               "#extension GL_KHR_blend_equation_advanced : require",extensionDirective);
    pRVar15 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    GetDef2DVtxSrc_abi_cxx11_(&local_280,(glcts *)(ulong)this->m_glslVersion,glslVersion);
    pcVar16 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,pcVar16,&local_281);
    pcVar16 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,pcVar16,(allocator<char> *)((long)&posBinding.pointer.data + 7))
    ;
    glu::makeVtxFragSources(&local_240,&local_260,&local_2a8);
    glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_170,pRVar15,&local_240);
    glu::ProgramSources::~ProgramSources(&local_240);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&posBinding.pointer.data + 7));
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator(&local_281);
    std::__cxx11::string::~string((string *)&local_280);
    bVar10 = glu::ShaderProgram::isOk((ShaderProgram *)local_170);
    if (!bVar10) {
      glu::operator<<(this_01,(ShaderProgram *)local_170);
      this_02 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_02,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                 ,0x2a7);
      __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    p_Var5 = gl_00->useProgram;
    dVar12 = glu::ShaderProgram::getProgram((ShaderProgram *)local_170);
    (*p_Var5)(dVar12);
    GVar13 = (*gl_00->getError)();
    glu::checkError(GVar13,"Program failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x2aa);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&i,"aPos",(allocator<char> *)((long)&j + 3));
    glu::va::Float((VertexArrayBinding *)local_300,(string *)&i,2,4,0,(float *)s_pos);
    std::__cxx11::string::~string((string *)&i);
    std::allocator<char>::~allocator((allocator<char> *)((long)&j + 3));
    (*gl_00->disable)(0xbd0);
    (*gl_00->enable)(0xbe2);
    p_Var6 = gl_00->clearColor;
    pfVar17 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(fbo.m_rbo + 1),0);
    GVar2 = *pfVar17;
    pfVar17 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(fbo.m_rbo + 1),1);
    GVar3 = *pfVar17;
    pfVar17 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(fbo.m_rbo + 1),2);
    GVar4 = *pfVar17;
    pfVar17 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(fbo.m_rbo + 1),3);
    (*p_Var6)(GVar2,GVar3,GVar4,*pfVar17);
    (*gl_00->clear)(0x4000);
    if (!bVar9) {
      (*gl_00->blendBarrier)();
    }
    for (local_328 = 0; local_328 < this->m_repeatCount; local_328 = local_328 + 1) {
      for (s._4_4_ = 0; s._4_4_ < this->m_numSteps; s._4_4_ = s._4_4_ + 1) {
        pBVar1 = this->m_steps + s._4_4_;
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(refCol.m_data + 2),pBVar1->src[0],pBVar1->src[1],
                   pBVar1->src[2],pBVar1->src[3]);
        Blend(agStack_358,pBVar1->mode,(Vec4 *)(refCol.m_data + 2),(Vec4 *)(fbo.m_rbo + 1));
        fbo._16_8_ = agStack_358;
        (*gl_00->blendEquation)(pBVar1->mode);
        GVar13 = (*gl_00->getError)();
        glu::checkError(GVar13,"BlendEquation failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                        ,0x2c6);
        p_Var7 = gl_00->uniform4f;
        p_Var8 = gl_00->getUniformLocation;
        dVar12 = glu::ShaderProgram::getProgram((ShaderProgram *)local_170);
        GVar14 = (*p_Var8)(dVar12,"uSrcCol");
        pfVar17 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(refCol.m_data + 2),0);
        GVar2 = *pfVar17;
        pfVar17 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(refCol.m_data + 2),1);
        GVar3 = *pfVar17;
        pfVar17 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(refCol.m_data + 2),2);
        GVar4 = *pfVar17;
        pfVar17 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(refCol.m_data + 2),3);
        (*p_Var7)(GVar14,GVar2,GVar3,GVar4,*pfVar17);
        GVar13 = (*gl_00->getError)();
        glu::checkError(GVar13,"Uniforms failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                        ,0x2ca);
        pRVar15 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
        dVar12 = glu::ShaderProgram::getProgram((ShaderProgram *)local_170);
        glu::pr::Triangles((PrimitiveList *)&result,6,(deUint16 *)s_indices);
        glu::draw(pRVar15,dVar12,1,(VertexArrayBinding *)local_300,(PrimitiveList *)&result,
                  (DrawUtilCallback *)0x0);
        GVar13 = (*gl_00->getError)();
        glu::checkError(GVar13,"Draw failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                        ,0x2cf);
        if (!bVar9) {
          (*gl_00->blendBarrier)();
        }
      }
    }
    _ref = (deUint8 *)operator_new__(0x400000);
    (*gl_00->readPixels)(0,0,0x400,0x400,0x1908,0x1401,_ref);
    GVar13 = (*gl_00->getError)();
    glu::checkError(GVar13,"Read pixels failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x2d9);
    local_37c = tcu::RGBA::fromBytes(_ref);
    tcu::RGBA::RGBA(&local_384,(Vec4 *)(fbo.m_rbo + 1));
    threshold = tcu::PixelFormat::convertColor(this_00,&local_384);
    RStack_38c = tcu::PixelFormat::getColorThreshold(this_00);
    local_390 = tcu::PixelFormat::getColorThreshold(this_00);
    i_1 = (int)tcu::operator+(&stack0xfffffffffffffc74,&local_390);
    local_398 = threshold.m_value;
    dStack_39c = local_37c.m_value;
    local_388 = (RGBA)i_1;
    local_391 = tcu::compareThreshold(threshold,local_37c,(RGBA)i_1);
    pass = true;
    for (local_3a8 = 0; local_3a8 < 0xffc00; local_3a8 = local_3a8 + 1) {
      local_67a = false;
      if (pass != false) {
        iVar11 = memcmp(_ref,_ref + (local_3a8 << 2),4);
        local_67a = iVar11 == 0;
      }
      pass = local_67a;
    }
    local_67b = false;
    if ((local_391 & 1) != 0) {
      local_67b = pass;
    }
    local_3a9 = local_67b;
    if (local_67b == false) {
      tcu::TestLog::operator<<(&local_530,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar18 = tcu::MessageBuilder::operator<<(&local_530,(char (*) [10])"Exceeds: ");
      pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,&local_388);
      pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(char (*) [7])" diff:");
      local_538 = threshold.m_value;
      local_53c = local_37c.m_value;
      local_534 = tcu::computeAbsDiff(threshold,local_37c);
      pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,&local_534);
      pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(char (*) [7])"  res:");
      pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,&local_37c);
      pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(char (*) [7])"  ref:");
      tcu::RGBA::RGBA(&local_540,(Vec4 *)(fbo.m_rbo + 1));
      pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,&local_540);
      tcu::MessageBuilder::operator<<(pMVar18,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_530);
    }
    if (_ref != (deUint8 *)0x0) {
      operator_delete__(_ref);
    }
    pcVar16 = "Fail (results differ)";
    if ((local_3a9 & 1U) != 0) {
      pcVar16 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (byte)~local_3a9 & QP_TEST_RESULT_FAIL,pcVar16);
    glu::VertexArrayBinding::~VertexArrayBinding((VertexArrayBinding *)local_300);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_170);
    std::__cxx11::string::~string((string *)local_90);
    FBOSentry::~FBOSentry((FBOSentry *)((long)&frgSrc.field_2 + 8));
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"GL_KHR_blend_equation_advanced");
  }
  return STOP;
}

Assistant:

CoherentBlendTestCaseGroup::CoherentBlendTest::IterateResult CoherentBlendTestCaseGroup::CoherentBlendTest::iterate(
	void)
{
	static const int		 dim = 1024;
	const tcu::RenderTarget& rt  = m_context.getRenderContext().getRenderTarget();
	const tcu::PixelFormat&  pf  = rt.getPixelFormat();
	const glw::Functions&	gl  = m_context.getRenderContext().getFunctions();
	TestLog&				 log = m_testCtx.getLog();

	// Check that extension is supported.
	if (!IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_KHR_blend_equation_advanced");
		return STOP;
	}

	bool needBarrier = !IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced_coherent");

	tcu::Vec4 dstCol(0.f, 0.f, 0.f, 0.f);

	FBOSentry fbo(gl, dim, dim, GL_RGBA8);

	// Setup progra
	std::string frgSrc = GetSolidShader("blend_support_all_equations", glu::getGLSLVersionDeclaration(m_glslVersion));
	glu::ShaderProgram p(m_context.getRenderContext(),
						 glu::makeVtxFragSources(GetDef2DVtxSrc(m_glslVersion).c_str(), frgSrc.c_str()));
	if (!p.isOk())
	{
		log << p;
		TCU_FAIL("Compile failed");
	}
	gl.useProgram(p.getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Program failed");

	glu::VertexArrayBinding posBinding = glu::va::Float("aPos", 2, 4, 0, &s_pos[0]);

	// Enable blending.
	gl.disable(GL_DITHER);
	gl.enable(GL_BLEND);

	// Clear.
	gl.clearColor(dstCol[0], dstCol[1], dstCol[2], dstCol[3]);
	gl.clear(GL_COLOR_BUFFER_BIT);

	// Blend barrier.
	if (needBarrier)
		gl.blendBarrier();

	// Repeat block.
	for (int i = 0; i < m_repeatCount; i++)
		// Loop blending steps.
		for (int j = 0; j < m_numSteps; j++)
		{
			const BlendStep& s = m_steps[j];
			tcu::Vec4		 srcCol(s.src[0], s.src[1], s.src[2], s.src[3]);
			tcu::Vec4		 refCol = Blend(s.mode, srcCol, dstCol);
			dstCol					= refCol;

			// Set blend equation.
			gl.blendEquation(s.mode);
			GLU_EXPECT_NO_ERROR(gl.getError(), "BlendEquation failed");

			// Set source color.
			gl.uniform4f(gl.getUniformLocation(p.getProgram(), "uSrcCol"), srcCol[0], srcCol[1], srcCol[2], srcCol[3]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Uniforms failed");

			// Draw.
			glu::draw(m_context.getRenderContext(), p.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(s_indices), &s_indices[0]));
			GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");

			// Blend barrier.
			if (needBarrier)
				gl.blendBarrier();
		}

	// Read the results.
	glw::GLubyte* result = new glw::GLubyte[4 * dim * dim];
	gl.readPixels(0, 0, dim, dim, GL_RGBA, GL_UNSIGNED_BYTE, result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels failed");

	// Check that first pixel is ok.
	tcu::RGBA res		= tcu::RGBA::fromBytes(result);
	tcu::RGBA ref		= pf.convertColor(tcu::RGBA(dstCol));
	tcu::RGBA threshold = pf.getColorThreshold() + pf.getColorThreshold();
	bool	  firstOk   = tcu::compareThreshold(ref, res, threshold);

	// Check that all pixels are the same as the first one.
	bool allSame = true;
	for (int i = 0; i < dim * (dim - 1); i++)
		allSame = allSame && (0 == memcmp(result, result + (i * 4), 4));

	bool pass = firstOk && allSame;
	if (!pass)
	{
		log << TestLog::Message << "Exceeds: " << threshold << " diff:" << tcu::computeAbsDiff(ref, res)
			<< "  res:" << res << "  ref:" << tcu::RGBA(dstCol) << TestLog::EndMessage;
	}

	delete[] result;

	m_testCtx.setTestResult(pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, pass ? "Pass" : "Fail (results differ)");
	return STOP;
}